

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O0

bool OutFlowBC::HasOutFlowBC(BCRec *_phys_bc)

{
  int idir;
  int numOutFlowBC;
  bool has_out_flow;
  BCRec *_phys_bc_local;
  
  has_out_flow = false;
  for (idir = 0; idir < 3; idir = idir + 1) {
    if (_phys_bc->bc[idir] == 2) {
      has_out_flow = true;
    }
    if (_phys_bc->bc[idir + 3] == 2) {
      has_out_flow = true;
    }
  }
  return has_out_flow;
}

Assistant:

bool
OutFlowBC::HasOutFlowBC (BCRec* _phys_bc)
{
    bool has_out_flow = false;
    int  numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }
    }

    return has_out_flow;
}